

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

void GlueFreeBlocks(CPpmd7 *p)

{
  byte bVar1;
  uint uVar2;
  Byte *pBVar3;
  uint uVar4;
  uint *puVar5;
  short *psVar6;
  uint k;
  CPpmd7_Node_Ref next_1;
  uint nu_2;
  CPpmd7_Node *node_2;
  CPpmd7_Node *node2;
  UInt32 nu_1;
  CPpmd7_Node *node_1;
  CPpmd7_Node *node;
  CPpmd7_Node_Ref next;
  uint uStack_18;
  UInt16 nu;
  uint i;
  CPpmd7_Node_Ref n;
  CPpmd7_Node_Ref head;
  CPpmd7 *p_local;
  
  uVar4 = p->AlignOffset + p->Size;
  p->GlueCount = 0xff;
  uStack_18 = uVar4;
  for (next = 0; next < 0x26; next = next + 1) {
    bVar1 = p->Indx2Units[next];
    node._4_4_ = p->FreeList[next];
    p->FreeList[next] = 0;
    while (node._4_4_ != 0) {
      puVar5 = (uint *)(p->Base + node._4_4_);
      puVar5[1] = uStack_18;
      uVar2 = node._4_4_;
      *(CPpmd_Void_Ref *)(p->Base + (ulong)uStack_18 + 8) = node._4_4_;
      node._4_4_ = *puVar5;
      *(undefined2 *)puVar5 = 0;
      *(ushort *)((long)puVar5 + 2) = (ushort)bVar1;
      uStack_18 = uVar2;
    }
  }
  pBVar3 = p->Base;
  (pBVar3 + uVar4)[0] = '\x01';
  (pBVar3 + uVar4)[1] = '\0';
  *(uint *)(p->Base + (ulong)uVar4 + 4) = uStack_18;
  *(uint *)(p->Base + (ulong)uStack_18 + 8) = uVar4;
  if (p->LoUnit != p->HiUnit) {
    pBVar3 = p->LoUnit;
    pBVar3[0] = '\x01';
    pBVar3[1] = '\0';
  }
  for (; uStack_18 != uVar4; uStack_18 = *(uint *)(pBVar3 + (ulong)uStack_18 + 4)) {
    pBVar3 = p->Base;
    node2._4_4_ = (uint)*(ushort *)(pBVar3 + (ulong)uStack_18 + 2);
    while( true ) {
      psVar6 = (short *)(p->Base + (ulong)node2._4_4_ * 0xc + (ulong)uStack_18);
      node2._4_4_ = (ushort)psVar6[1] + node2._4_4_;
      if ((*psVar6 != 0) || (0xffff < node2._4_4_)) break;
      *(undefined4 *)(p->Base + (ulong)*(uint *)(psVar6 + 4) + 4) = *(undefined4 *)(psVar6 + 2);
      *(undefined4 *)(p->Base + (ulong)*(uint *)(psVar6 + 2) + 8) = *(undefined4 *)(psVar6 + 4);
      *(short *)(pBVar3 + (ulong)uStack_18 + 2) = (short)node2._4_4_;
    }
  }
  uStack_18 = *(uint *)(p->Base + (ulong)uVar4 + 4);
  while (uStack_18 != uVar4) {
    _next_1 = p->Base + uStack_18;
    uStack_18 = *(uint *)(_next_1 + 4);
    for (k = (uint)*(ushort *)(_next_1 + 2); 0x80 < k; k = k - 0x80) {
      InsertNode(p,_next_1,0x25);
      _next_1 = _next_1 + 0x600;
    }
    next = (CPpmd7_Node_Ref)p->Units2Indx[k - 1];
    if (p->Indx2Units[next] != k) {
      next = next - 1;
      InsertNode(p,_next_1 + (ulong)(uint)p->Indx2Units[next] * 0xc,(k - p->Indx2Units[next]) - 1);
    }
    InsertNode(p,_next_1,next);
  }
  return;
}

Assistant:

static void GlueFreeBlocks(CPpmd8 *p)
{
  CPpmd8_Node_Ref head = 0;
  CPpmd8_Node_Ref *prev = &head;
  unsigned i;

  p->GlueCount = 1 << 13;
  memset(p->Stamps, 0, sizeof(p->Stamps));
  
  /* Order-0 context is always at top UNIT, so we don't need guard NODE at the end.
     All blocks up to p->LoUnit can be free, so we need guard NODE at LoUnit. */
  if (p->LoUnit != p->HiUnit)
    ((CPpmd8_Node *)p->LoUnit)->Stamp = 0;

  /* Glue free blocks */
  for (i = 0; i < PPMD_NUM_INDEXES; i++)
  {
    CPpmd8_Node_Ref next = (CPpmd8_Node_Ref)p->FreeList[i];
    p->FreeList[i] = 0;
    while (next != 0)
    {
      CPpmd8_Node *node = NODE(next);
      if (node->NU != 0)
      {
        CPpmd8_Node *node2;
        *prev = next;
        prev = &(node->Next);
        while ((node2 = node + node->NU)->Stamp == EMPTY_NODE)
        {
          node->NU += node2->NU;
          node2->NU = 0;
        }
      }
      next = node->Next;
    }
  }
  *prev = 0;
  
  /* Fill lists of free blocks */
  while (head != 0)
  {
    CPpmd8_Node *node = NODE(head);
    unsigned nu;
    head = node->Next;
    nu = node->NU;
    if (nu == 0)
      continue;
    for (; nu > 128; nu -= 128, node += 128)
      InsertNode(p, node, PPMD_NUM_INDEXES - 1);
    if (I2U(i = U2I(nu)) != nu)
    {
      unsigned k = I2U(--i);
      InsertNode(p, node + k, nu - k - 1);
    }
    InsertNode(p, node, i);
  }
}